

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_info_subject_alt_name(char **buf,size_t *size,mbedtls_x509_sequence *subject_alt_name)

{
  char *pcVar1;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  bool bVar9;
  
  uVar2 = *size;
  pcVar1 = *buf;
  if (subject_alt_name != (mbedtls_x509_sequence *)0x0) {
    bVar7 = false;
    lVar6 = 0;
    pcVar4 = anon_var_dwarf_2f782 + 9;
    do {
      sVar3 = (subject_alt_name->buf).len;
      bVar9 = uVar2 < sVar3 + lVar6;
      uVar2 = uVar2 - (sVar3 + lVar6);
      if (bVar9 || uVar2 == 0) {
        *pcVar1 = '\0';
        return -0x2980;
      }
      if (bVar7) {
        lVar8 = 0;
        do {
          pcVar1[lVar8] = pcVar4[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
        sVar3 = (subject_alt_name->buf).len;
        pcVar1 = pcVar1 + lVar8;
      }
      if (sVar3 != 0) {
        uVar5 = 0;
        do {
          pcVar1[uVar5] = (subject_alt_name->buf).p[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar5 < (subject_alt_name->buf).len);
        pcVar1 = pcVar1 + uVar5;
      }
      subject_alt_name = subject_alt_name->next;
      lVar6 = 2;
      bVar7 = true;
      pcVar4 = ", ";
    } while (subject_alt_name != (mbedtls_asn1_sequence *)0x0);
  }
  *pcVar1 = '\0';
  *size = uVar2;
  *buf = pcVar1;
  return 0;
}

Assistant:

static int x509_info_subject_alt_name( char **buf, size_t *size,
                                       const mbedtls_x509_sequence *subject_alt_name )
{
    size_t i;
    size_t n = *size;
    char *p = *buf;
    const mbedtls_x509_sequence *cur = subject_alt_name;
    const char *sep = "";
    size_t sep_len = 0;

    while( cur != NULL )
    {
        if( cur->buf.len + sep_len >= n )
        {
            *p = '\0';
            return( MBEDTLS_ERR_X509_BUFFER_TOO_SMALL );
        }

        n -= cur->buf.len + sep_len;
        for( i = 0; i < sep_len; i++ )
            *p++ = sep[i];
        for( i = 0; i < cur->buf.len; i++ )
            *p++ = cur->buf.p[i];

        sep = ", ";
        sep_len = 2;

        cur = cur->next;
    }

    *p = '\0';

    *size = n;
    *buf = p;

    return( 0 );
}